

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  char __c;
  size_type sVar1;
  char *pcVar2;
  pointer pbVar3;
  SpecialProperties SVar4;
  int iVar5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  string *this;
  bool bVar9;
  long lVar10;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  TestCaseInfo info;
  string local_180;
  SourceLineInfo *local_160;
  TestCase *local_158;
  NameAndTags *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ITestInvoker *local_e8;
  string *local_e0;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  sVar1 = (nameAndTags->tags).m_size;
  local_e8 = _testCase;
  local_e0 = _className;
  if (sVar1 != 0) {
    pcVar2 = (nameAndTags->tags).m_start;
    sVar6 = 0;
    bVar9 = false;
    bVar8 = false;
    local_160 = _lineInfo;
    local_158 = __return_storage_ptr__;
    local_150 = nameAndTags;
    do {
      __c = pcVar2[sVar6];
      if (bVar8) {
        this = &local_180;
        if (__c == ']') {
          SVar4 = anon_unknown_1::parseSpecialTag(this);
          bVar8 = true;
          if (((((SVar4 & IsHidden) == None) && (bVar8 = bVar9, SVar4 == None)) &&
              (SVar4 = anon_unknown_1::parseSpecialTag(&local_180), SVar4 == None)) &&
             ((local_180._M_string_length != 0 &&
              (iVar5 = isalnum((uint)(byte)*local_180._M_dataplus._M_p), iVar5 == 0)))) {
            ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_128);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,"Tag name: [",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,local_180._M_dataplus._M_p
                       ,local_180._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,"] is not allowed.\n",0x12
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_128.field_2._M_allocated_capacity,
                       "Tag names starting with non alphanumeric characters are reserved\n",0x41);
            operator<<((ostream *)local_128.field_2._M_allocated_capacity,local_160);
            std::__cxx11::stringbuf::str();
            throw_domain_error((string *)local_d8);
          }
          bVar9 = bVar8;
          if (((local_180._M_string_length != 0) && (local_180._M_string_length != 1)) &&
             (*local_180._M_dataplus._M_p == 0x2e)) {
            clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase(&local_180,0,1);
          }
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&local_180);
          local_180._M_string_length = 0;
          *local_180._M_dataplus._M_p = 0;
          bVar8 = false;
          nameAndTags = local_150;
        }
        else {
LAB_001281c7:
          clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(this,__c);
        }
      }
      else {
        this = &local_108;
        if (__c != '[') goto LAB_001281c7;
        bVar8 = true;
      }
      pbVar3 = local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
    __return_storage_ptr__ = local_158;
    _lineInfo = local_160;
    if (bVar9) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,".","");
      paVar7 = &local_a8;
      local_b8[0]._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"!hide","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 pbVar3,local_d8,local_98);
      _lineInfo = local_160;
      lVar10 = -0x40;
      do {
        if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar7->_M_allocated_capacity)[-2]) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1)
          ;
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar7->_M_allocated_capacity + -4);
        lVar10 = lVar10 + 0x20;
        __return_storage_ptr__ = local_158;
        nameAndTags = local_150;
      } while (lVar10 != 0);
    }
  }
  pcVar2 = (nameAndTags->name).m_start;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,pcVar2,pcVar2 + (nameAndTags->name).m_size);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_d8,&local_128,local_e0,&local_108,&local_148,_lineInfo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,(ulong)(local_128.field_2._M_allocated_capacity + 1))
    ;
  }
  TestCase::TestCase(__return_storage_ptr__,local_e8,(TestCaseInfo *)local_d8);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_60);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_p != &local_88) {
    operator_delete(local_98[0]._M_p,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0]._M_p != &local_a8) {
    operator_delete(local_b8[0]._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }